

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

int Kit_TruthIsEqual(uint *pIn0,uint *pIn1,int nVars)

{
  int local_28;
  int w;
  int nVars_local;
  uint *pIn1_local;
  uint *pIn0_local;
  
  local_28 = Kit_TruthWordNum(nVars);
  do {
    local_28 = local_28 + -1;
    if (local_28 < 0) {
      return 1;
    }
  } while (pIn0[local_28] == pIn1[local_28]);
  return 0;
}

Assistant:

static inline int Kit_TruthIsEqual( unsigned * pIn0, unsigned * pIn1, int nVars )
{
    int w;
    for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
        if ( pIn0[w] != pIn1[w] )
            return 0;
    return 1;
}